

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ByteData *
cfd::core::CalculateRangeProof
          (ByteData *__return_storage_ptr__,uint64_t value,Pubkey *pubkey,Privkey *privkey,
          ConfidentialAssetId *asset,vector<unsigned_char,_std::allocator<unsigned_char>_> *abf,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbf,Script *script,
          int64_t minimum_range_value,int exponent,int minimum_bits,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *commitment,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *range_proof)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  ScriptOperator *this;
  CfdException *pCVar4;
  int ret;
  undefined1 local_128 [32];
  uint64_t local_108;
  pointer local_100;
  pointer local_f8;
  pointer local_f0;
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> generator;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  pointer local_58;
  pointer local_50;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_48;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&generator,0x21,
             (allocator_type *)local_128);
  ConfidentialAssetId::GetUnblindedData((ByteData *)local_128,asset);
  local_108 = value;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,
                     (ByteData *)local_128);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
  puVar1 = (abf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ret = wally_asset_generator_from_bytes
                  (local_88._M_impl.super__Vector_impl_data._M_start,
                   (long)local_88._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_88._M_impl.super__Vector_impl_data._M_start,puVar1,
                   (long)(abf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)puVar1,
                   generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  if (ret != 0) {
    local_128._0_8_ = "cfdcore_elements_transaction.cpp";
    local_128._8_4_ = 0x7f;
    local_128._16_8_ = "CalculateRangeProof";
    logger::warn<int&>((CfdSourceLocation *)local_128,"wally_asset_generator_from_bytes NG[{}].",
                       &ret);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_128,"output asset generator error.",(allocator *)&local_a0);
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_128);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment,0x21);
  puVar1 = (vbf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (commitment->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ret = wally_asset_value_commitment
                  (local_108,puVar1,
                   (long)(vbf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)puVar1,
                   generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,puVar2,
                   (long)(commitment->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar2);
  if (ret != 0) {
    local_128._0_8_ = "cfdcore_elements_transaction.cpp";
    local_128._8_4_ = 0x88;
    local_128._16_8_ = "CalculateRangeProof";
    logger::warn<int&>((CfdSourceLocation *)local_128,"wally_asset_value_commitment NG[{}].",&ret);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_128,"calc asset commitment error.",(allocator *)&local_a0);
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_128);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof,0x140e);
  size = 0;
  Privkey::GetData((ByteData *)local_128,privkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,
                     (ByteData *)local_128);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
  Script::GetData((ByteData *)local_128,script);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8,
                     (ByteData *)local_128);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
  Script::GetElementList(&local_48,script);
  if (local_48.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this = ScriptElement::GetOpCode
                     (local_48.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    bVar3 = ScriptOperator::operator==(this,(ScriptOperator *)ScriptOperator::OP_RETURN);
    if ((!bVar3) &&
       ((ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8._M_impl.super__Vector_impl_data._M_start) < 0x2711)) {
      if (local_108 == 0) {
        local_128._0_8_ = "cfdcore_elements_transaction.cpp";
        local_128._8_4_ = 0x9b;
        local_128._16_8_ = "CalculateRangeProof";
        logger::warn<>((CfdSourceLocation *)local_128,
                       "Amount is 0. Cannot specify 0 for amount if there is a valid confidential address."
                      );
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)local_128,
                   "Amount is 0. Cannot specify 0 for amount if there is a valid confidential address."
                   ,(allocator *)&local_70);
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_128);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (local_108 < (ulong)minimum_range_value) {
        local_128._0_8_ = "cfdcore_elements_transaction.cpp";
        local_128._8_4_ = 0xa5;
        local_128._16_8_ = "CalculateRangeProof";
        logger::warn<>((CfdSourceLocation *)local_128,"amount less than minimumRangeValue");
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)local_128,"The amount is less than the minimumRangeValue.",
                   (allocator *)&local_70);
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_128);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      goto LAB_0020a485;
    }
  }
  minimum_range_value = 0;
LAB_0020a485:
  if (pubkey == (Pubkey *)0x0) {
    puVar1 = (abf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_f0 = (vbf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_f8 = (commitment->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
    local_100 = local_b8._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (range_proof->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_start;
    ret = wally_asset_rangeproof_with_nonce
                    (local_108,local_a0._M_impl.super__Vector_impl_data._M_start,
                     (long)local_a0._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_a0._M_impl.super__Vector_impl_data._M_start,
                     local_88._M_impl.super__Vector_impl_data._M_start,
                     (long)local_88._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_88._M_impl.super__Vector_impl_data._M_start,puVar1,
                     (long)(abf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar1,local_f0,
                     (long)(vbf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)local_f0,local_f8,
                     (long)(commitment->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)local_f8,
                     local_b8._M_impl.super__Vector_impl_data._M_start,
                     (long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_b8._M_impl.super__Vector_impl_data._M_start,
                     generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)generator.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)generator.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,minimum_range_value,exponent,
                     minimum_bits,puVar2,
                     (long)(range_proof->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar2,&size);
  }
  else {
    Pubkey::GetData((ByteData *)&local_70,pubkey);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128,
                       (ByteData *)&local_70);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
    local_f0 = local_88._M_impl.super__Vector_impl_data._M_finish +
               -(long)local_88._M_impl.super__Vector_impl_data._M_start;
    local_f8 = (abf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_100 = (vbf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
    local_50 = (commitment->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
    local_58 = local_b8._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (range_proof->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_start;
    ret = wally_asset_rangeproof
                    (local_108,local_128._0_8_,
                     CONCAT44(local_128._12_4_,local_128._8_4_) - local_128._0_8_,
                     local_a0._M_impl.super__Vector_impl_data._M_start,
                     (long)local_a0._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_a0._M_impl.super__Vector_impl_data._M_start,
                     local_88._M_impl.super__Vector_impl_data._M_start,local_f0,local_f8,
                     (long)(abf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)local_f8,local_100,
                     (long)(vbf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)local_100,local_50,
                     (long)(commitment->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)local_50,
                     local_b8._M_impl.super__Vector_impl_data._M_start,
                     (long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_b8._M_impl.super__Vector_impl_data._M_start,
                     generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)generator.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)generator.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,minimum_range_value,exponent,
                     minimum_bits,puVar1,
                     (long)(range_proof->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar1,&size);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
  }
  if (ret == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof,size);
    ByteData::ByteData(__return_storage_ptr__,&generator);
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              (&local_48);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_128._0_8_ = "cfdcore_elements_transaction.cpp";
  local_128._8_4_ = 0xbf;
  local_128._16_8_ = "CalculateRangeProof";
  logger::warn<int&>((CfdSourceLocation *)local_128,"wally_asset_rangeproof NG[{}].",&ret);
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_128,"calc asset rangeproof error.",(allocator *)&local_70);
  CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_128);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

static ByteData CalculateRangeProof(
    const uint64_t value, const Pubkey *pubkey, const Privkey &privkey,
    const ConfidentialAssetId &asset, const std::vector<uint8_t> &abf,
    const std::vector<uint8_t> &vbf, const Script &script,
    int64_t minimum_range_value, int exponent, int minimum_bits,
    std::vector<uint8_t> *commitment, std::vector<uint8_t> *range_proof) {
  std::vector<uint8_t> generator(ASSET_GENERATOR_LEN);
  const std::vector<uint8_t> &asset_bytes =
      asset.GetUnblindedData().GetBytes();
  int ret = wally_asset_generator_from_bytes(
      asset_bytes.data(), asset_bytes.size(), abf.data(), abf.size(),
      generator.data(), generator.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_generator_from_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "output asset generator error.");
  }

  commitment->resize(ASSET_COMMITMENT_LEN);
  ret = wally_asset_value_commitment(
      value, vbf.data(), vbf.size(), generator.data(), generator.size(),
      commitment->data(), commitment->size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_value_commitment NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "calc asset commitment error.");
  }
  // info(
  //    CFD_LOG_SOURCE, "generator=[{}] commitment=[{}]",
  //    ByteData(generator).GetHex(), ByteData(commitment).GetHex());

  range_proof->resize(ASSET_RANGEPROOF_MAX_LEN);
  size_t size = 0;
  const std::vector<uint8_t> &privkey_byte = privkey.GetData().GetBytes();
  const std::vector<uint8_t> &script_byte = script.GetData().GetBytes();
  const std::vector<ScriptElement> &script_item = script.GetElementList();
  int64_t min_range_value = minimum_range_value;
  if (script_item.empty() ||
      (script_item[0].GetOpCode() == ScriptOperator::OP_RETURN) ||
      (script_byte.size() > Script::kMaxScriptSize)) {
    min_range_value = 0;
  } else if (value == 0) {
    warn(
        CFD_LOG_SOURCE,
        "Amount is 0. Cannot specify 0 for amount "
        "if there is a valid confidential address.");  // NOLINT
    throw CfdException(
        kCfdIllegalArgumentError,
        "Amount is 0. Cannot specify 0 for amount "
        "if there is a valid confidential address.");  // NOLINT
  }

  if (value < static_cast<uint64_t>(min_range_value)) {
    warn(CFD_LOG_SOURCE, "amount less than minimumRangeValue");
    throw CfdException(
        kCfdIllegalArgumentError,
        "The amount is less than the minimumRangeValue.");
  }

  if (pubkey == nullptr) {
    ret = wally_asset_rangeproof_with_nonce(
        value, privkey_byte.data(), privkey_byte.size(), asset_bytes.data(),
        asset_bytes.size(), abf.data(), abf.size(), vbf.data(), vbf.size(),
        commitment->data(), commitment->size(), script_byte.data(),
        script_byte.size(), generator.data(), generator.size(),
        static_cast<uint64_t>(min_range_value), exponent, minimum_bits,
        range_proof->data(), range_proof->size(), &size);
  } else {
    const std::vector<uint8_t> &pubkey_byte = pubkey->GetData().GetBytes();
    ret = wally_asset_rangeproof(
        value, pubkey_byte.data(), pubkey_byte.size(), privkey_byte.data(),
        privkey_byte.size(), asset_bytes.data(), asset_bytes.size(),
        abf.data(), abf.size(), vbf.data(), vbf.size(), commitment->data(),
        commitment->size(), script_byte.data(), script_byte.size(),
        generator.data(), generator.size(),
        static_cast<uint64_t>(min_range_value), exponent, minimum_bits,
        range_proof->data(), range_proof->size(), &size);
  }
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_rangeproof NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "calc asset rangeproof error.");
  }
  range_proof->resize(size);
  return ByteData(generator);
}